

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

void __thiscall
slang::SmallVector<slang::ast::OpaqueInstancePath::Entry,_5UL>::SmallVector
          (SmallVector<slang::ast::OpaqueInstancePath::Entry,_5UL> *this,Base *other)

{
  move_iterator<slang::ast::OpaqueInstancePath::Entry_*> first;
  size_type sVar1;
  
  (this->super_SmallVectorBase<slang::ast::OpaqueInstancePath::Entry>).data_ =
       (pointer)(this->super_SmallVectorBase<slang::ast::OpaqueInstancePath::Entry>).firstElement;
  (this->super_SmallVectorBase<slang::ast::OpaqueInstancePath::Entry>).len = 0;
  (this->super_SmallVectorBase<slang::ast::OpaqueInstancePath::Entry>).cap = 0;
  first._M_current = other->data_;
  if (first._M_current == (Entry *)other->firstElement) {
    (this->super_SmallVectorBase<slang::ast::OpaqueInstancePath::Entry>).cap = 5;
    SmallVectorBase<slang::ast::OpaqueInstancePath::Entry>::
    append<std::move_iterator<slang::ast::OpaqueInstancePath::Entry_*>_>
              (&this->super_SmallVectorBase<slang::ast::OpaqueInstancePath::Entry>,first,
               first._M_current + other->len);
    other->len = 0;
  }
  else {
    other->data_ = (pointer)0x0;
    (this->super_SmallVectorBase<slang::ast::OpaqueInstancePath::Entry>).data_ = first._M_current;
    sVar1 = other->len;
    other->len = 0;
    (this->super_SmallVectorBase<slang::ast::OpaqueInstancePath::Entry>).len = sVar1;
    sVar1 = other->cap;
    other->cap = 0;
    (this->super_SmallVectorBase<slang::ast::OpaqueInstancePath::Entry>).cap = sVar1;
  }
  return;
}

Assistant:

SmallVector(Base&& other) noexcept {
        if (other.isSmall()) {
            this->cap = N;
            this->append(std::make_move_iterator(other.begin()),
                         std::make_move_iterator(other.end()));
            other.clear();
        }
        else {
            this->data_ = std::exchange(other.data_, nullptr);
            this->len = std::exchange(other.len, 0);
            this->cap = std::exchange(other.cap, 0);
        }
    }